

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::truncSatToUI16(Literal *__return_storage_ptr__,Literal *this)

{
  bool bVar1;
  int32_t val;
  Literal local_50;
  Literal local_38;
  BasicType local_1c;
  Literal *local_18;
  Literal *this_local;
  
  local_1c = f32;
  local_18 = this;
  this_local = __return_storage_ptr__;
  bVar1 = wasm::Type::operator==(&this->type,&local_1c);
  if (!bVar1) {
    handle_unreachable("invalid type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                       ,0x39e);
  }
  Literal(&local_50,this);
  castToI32(&local_38,&local_50);
  val = geti32(&local_38);
  saturating_trunc<float,_unsigned_short,_&wasm::isInRangeI16TruncU>(__return_storage_ptr__,val);
  ~Literal(&local_38);
  ~Literal(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::truncSatToUI16() const {
  if (type == Type::f32) {
    return saturating_trunc<float, uint16_t, isInRangeI16TruncU>(
      Literal(*this).castToI32().geti32());
  }
  WASM_UNREACHABLE("invalid type");
}